

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_PrintToTest_x_iutest_x_Iomanip_Test::Body
          (iu_PrintToTest_x_iutest_x_Iomanip_Test *this)

{
  Fixed *pFVar1;
  AssertionHelper local_390;
  Fixed local_360;
  AssertionHelper local_1d8;
  Fixed local_198;
  iu_PrintToTest_x_iutest_x_Iomanip_Test *local_10;
  iu_PrintToTest_x_iutest_x_Iomanip_Test *this_local;
  
  local_10 = this;
  memset(&local_198,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_198);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<
                     (&local_198,std::endl<char,std::char_traits<char>>);
  iutest::AssertionHelper::AssertionHelper
            (&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x400,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_1d8,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_1d8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_198);
  memset(&local_360,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_360);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<
                     (&local_360,std::ends<char,std::char_traits<char>>);
  iutest::AssertionHelper::AssertionHelper
            (&local_390,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x401,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_390,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_390);
  iutest::AssertionHelper::Fixed::~Fixed(&local_360);
  return;
}

Assistant:

IUTEST(PrintToTest, Iomanip)
{
    IUTEST_SUCCEED() << ::std::endl;
    IUTEST_SUCCEED() << ::std::ends;
}